

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O0

SQHash HashObj(SQObjectPtr *key)

{
  SQObjectType SVar1;
  SQObjectPtr *key_local;
  SQTable *local_8;
  
  SVar1 = (key->super_SQObject)._type;
  if ((SVar1 == OT_BOOL) || (SVar1 == OT_INTEGER)) {
    local_8 = (key->super_SQObject)._unVal.pTable;
  }
  else if (SVar1 == OT_FLOAT) {
    local_8 = (SQTable *)(long)(key->super_SQObject)._unVal.fFloat;
  }
  else if (SVar1 == OT_STRING) {
    local_8 = (((key->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate;
  }
  else {
    local_8 = (SQTable *)((key->super_SQObject)._unVal.nInteger >> 3);
  }
  return (SQHash)local_8;
}

Assistant:

inline SQHash HashObj(const SQObjectPtr &key)
{
    switch(sq_type(key)) {
        case OT_STRING:     return _string(key)->_hash;
        case OT_FLOAT:      return (SQHash)((SQInteger)_float(key));
        case OT_BOOL: case OT_INTEGER:  return (SQHash)((SQInteger)_integer(key));
        default:            return hashptr(key._unVal.pRefCounted);
    }
}